

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O0

bool script_segwit_tests::anon_unknown_20::IsExpectedWitnessProgram
               (CScript *script,int expectedVersion,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expectedProgram)

{
  bool bVar1;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> actualProgram;
  int actualVersion;
  char *in_stack_fffffffffffffe88;
  lazy_ostream *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  lazy_ostream *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  unit_test_log_t *in_stack_fffffffffffffec8;
  unit_test_log_t *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed0;
  int *version;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  bool local_f1;
  const_string local_f0 [2];
  lazy_ostream local_d0 [2];
  assertion_result local_b0 [2];
  undefined1 local_78 [16];
  int local_28 [6];
  undefined1 local_10 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  version = local_28;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe88);
  bVar1 = CScript::IsWitnessProgram
                    ((CScript *)
                     CONCAT17(in_stack_fffffffffffffee7,
                              CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)),version
                     ,in_stack_fffffffffffffed0);
  if (bVar1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
                 (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe88);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffec8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (size_t)in_stack_fffffffffffffeb8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffffe90,(char (*) [1])in_stack_fffffffffffffe88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
                 (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe98 = "expectedVersion";
      in_stack_fffffffffffffe90 = (lazy_ostream *)&stack0xfffffffffffffff4;
      in_stack_fffffffffffffe88 = "actualVersion";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (&stack0xffffffffffffff98,local_78,0x4f,1,2,local_10);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffe88);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      this = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
                 (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe88);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this,(const_string *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (size_t)in_stack_fffffffffffffeb8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      in_stack_fffffffffffffec7 =
           std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffeb8,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffe98,
                 SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
      in_stack_fffffffffffffeb8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
                 (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffe90,(basic_cstring<const_char> *)in_stack_fffffffffffffe88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
                 (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe88 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_b0,local_d0,local_f0,0x50,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffe88);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe88);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_f1 = true;
  }
  else {
    local_f1 = false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_f1;
}

Assistant:

bool IsExpectedWitnessProgram(const CScript& script, const int expectedVersion, const std::vector<unsigned char>& expectedProgram)
{
    int actualVersion;
    std::vector<unsigned char> actualProgram;
    if (!script.IsWitnessProgram(actualVersion, actualProgram)) {
        return false;
    }
    BOOST_CHECK_EQUAL(actualVersion, expectedVersion);
    BOOST_CHECK(actualProgram == expectedProgram);
    return true;
}